

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,string *shaderSource,
               ExpectResult expect)

{
  ostringstream *this;
  TestLog *log;
  string message;
  int length;
  char *source;
  Shader shader;
  string local_248;
  int local_224;
  pointer local_220;
  Shader local_218;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  log = (ctx->super_CallLogWrapper).m_log;
  local_220 = (shaderSource->_M_dataplus)._M_p;
  local_224 = (int)shaderSource->_M_string_length;
  glu::Shader::Shader(&local_218,ctx->m_renderCtx,shaderType);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  glu::Shader::setSources(&local_218,1,&local_220,&local_224);
  glu::Shader::compile(&local_218);
  glu::operator<<(log,&local_218);
  if (expect == EXPECT_RESULT_PASS) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_248,0,(char *)local_248._M_string_length,0x1cbf1a8);
    local_218.m_info.compileOk = (bool)(local_218.m_info.compileOk ^ 1);
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&local_248,0,(char *)local_248._M_string_length,0x1cbc013);
  }
  if (local_218.m_info.compileOk != false) {
    this = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,local_248._M_dataplus._M_p,local_248._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_138);
    NegativeTestContext::fail(ctx,&local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  glu::Shader::~Shader(&local_218);
  return;
}

Assistant:

void verifyShader(NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource, ExpectResult expect)
{
	DE_ASSERT(expect >= EXPECT_RESULT_PASS && expect < EXPECT_RESULT_LAST);

	tcu::TestLog&		log			= ctx.getLog();
	bool				testFailed	= false;
	const char* const	source		= shaderSource.c_str();
	const int			length		= (int) shaderSource.size();
	glu::Shader			shader		(ctx.getRenderContext(), shaderType);
	std::string			message;

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;

	if (expect == EXPECT_RESULT_PASS)
	{
		testFailed = !shader.getCompileStatus();
		message = "Shader did not compile.";
	}
	else
	{
		testFailed = shader.getCompileStatus();
		message = "Shader was not expected to compile.";
	}

	if (testFailed)
	{
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}